

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdmiCecSimulationDataGenerator.cpp
# Opt level: O0

void __thiscall HdmiCecSimulationDataGenerator::GenStartSeq(HdmiCecSimulationDataGenerator *this)

{
  HdmiCecSimulationDataGenerator *this_local;
  
  if (this->mErrorType == ERR_NOSTARTSEQ) {
    this->mErrorType = ERR_NOERROR;
  }
  else {
    SimulationChannelDescriptor::TransitionIfNeeded((int)this + 0x10);
    SimulationChannelDescriptor::Transition();
    Advance(this,3.7);
    SimulationChannelDescriptor::Transition();
    Advance(this,0.79999995);
  }
  return;
}

Assistant:

void HdmiCecSimulationDataGenerator::GenStartSeq()
{
    if( mErrorType == ERR_NOSTARTSEQ )
    {
        mErrorType = ERR_NOERROR;
        return;
    }

    // The bus must be in high
    mCecSimulationData.TransitionIfNeeded( BIT_HIGH );

    // Timing values from CEC 1.3a section 5.2.1 "Start Bit Timing"
    mCecSimulationData.Transition(); // HIGH to LOW
    Advance( HdmiCec::Tim_Start_A );

    mCecSimulationData.Transition(); // LOW to HIGH
    Advance( HdmiCec::Tim_Start_B - HdmiCec::Tim_Start_A );
}